

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O3

void sesschan_free(Channel *chan)

{
  ChannelVtable *ptr;
  long lVar1;
  
  delete_callbacks_for_context(&chan[-0x5e].initial_fixed_window_size);
  conf_free((Conf *)chan[-0x5c].vt);
  if (*(long **)&chan[-5].initial_fixed_window_size != (long *)0x0) {
    (**(code **)(**(long **)&chan[-5].initial_fixed_window_size + 8))();
  }
  bufchain_clear((bufchain *)(chan + -4));
  if (*(long **)&chan[-2].initial_fixed_window_size != (long *)0x0) {
    (**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 8))();
  }
  if (0 < (int)chan[-7].initial_fixed_window_size) {
    lVar1 = 0;
    do {
      (**(code **)((&chan[-6].vt)[lVar1]->free + 8))();
      lVar1 = lVar1 + 1;
    } while (lVar1 < (int)chan[-7].initial_fixed_window_size);
  }
  ptr = chan[-5].vt;
  if (ptr != (ChannelVtable *)0x0) {
    if (ptr->open_confirmation != (_func_void_Channel_ptr *)0x0) {
      (**(code **)(*(long *)ptr->open_confirmation + 8))();
    }
    safefree(ptr);
  }
  safefree(&chan[-0x5e].initial_fixed_window_size);
  return;
}

Assistant:

static void sesschan_free(Channel *chan)
{
    sesschan *sess = container_of(chan, sesschan, chan);
    int i;

    delete_callbacks_for_context(sess);
    conf_free(sess->conf);
    if (sess->backend)
        backend_free(sess->backend);
    bufchain_clear(&sess->subsys_input);
    if (sess->sftpsrv)
        sftpsrv_free(sess->sftpsrv);
    for (i = 0; i < sess->n_x11_sockets; i++)
        sk_close(sess->x11_sockets[i]);
    if (sess->agent)
        agentfwd_free(sess->agent);

    sfree(sess);
}